

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_TreeFindTreesTest(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  void *__ptr;
  Vec_Wec_t *__ptr_00;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  timespec ts;
  timespec local_50;
  Vec_Wec_t *local_40;
  Vec_Int_t *local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pVVar5 = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar4 = Ree_ManCountFadds(pVVar5);
  printf("Detected %d adders (%d FAs and %d HAs).  ",(ulong)(uint)(pVVar5->nSize / 6),(ulong)uVar4);
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  uVar4 = 0;
  Abc_Print(iVar8,"%s =","Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  local_40 = Acec_TreeFindTrees(p,pVVar5,(Vec_Bit_t *)0x0,0,0);
  uVar1 = local_40->nSize;
  uVar9 = (ulong)(int)uVar1;
  if (0 < (long)uVar9) {
    lVar7 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + *(int *)((long)&local_40->pArray->nSize + lVar7);
      lVar7 = lVar7 + 0x10;
    } while (uVar9 << 4 != lVar7);
    uVar4 = iVar3 / 2;
  }
  printf("Collected %d trees with %d adders in them.  ",(ulong)uVar1,(ulong)uVar4);
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  local_38 = pVVar5;
  Abc_Print(iVar8,"%s =","Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
  if (0 < (int)uVar1) {
    pVVar5 = local_40->pArray;
    uVar10 = 0;
    do {
      printf(" %4d : {",uVar10 & 0xffffffff);
      if (0 < pVVar5[uVar10].nSize) {
        lVar6 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar5[uVar10].pArray[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVVar5[uVar10].nSize);
      }
      puts(" }");
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
  }
  pVVar5 = local_38;
  __ptr_00 = local_40;
  iVar3 = local_40->nCap;
  if (0 < (long)iVar3) {
    pVVar2 = local_40->pArray;
    lVar6 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->pArray + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar2->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar6);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  if (pVVar5->pArray != (int *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (int *)0x0;
  }
  if (pVVar5 != (Vec_Int_t *)0x0) {
    free(pVVar5);
  }
  return;
}

Assistant:

void Acec_TreeFindTreesTest( Gia_Man_t * p )
{
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WecPrint( vTrees, 0 );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}